

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O1

void secp256k1_sha256_finalize(secp256k1_sha256 *hash,uchar *out32)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  uint32_t sizedesc [2];
  uint32_t out [8];
  uint local_50;
  uint local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  uVar2 = hash->bytes;
  uVar4 = (uint)uVar2;
  uVar1 = (uint)(uVar2 >> 0x20);
  local_50 = uVar1 >> 0x15 & 0xff |
             uVar1 >> 5 & 0xff00 | (uint)(uVar2 >> 0x15) & 0xff0000 | (int)(uVar2 >> 0x1d) << 0x18;
  local_4c = (uint)(uVar2 >> 0x15) & 0xff |
             (uint)(uVar2 >> 5) & 0xff00 | (uVar4 & 0x1fe0) << 0xb | uVar4 << 0x1b;
  secp256k1_sha256_write(hash,secp256k1_sha256_finalize::pad,(ulong)(0x37 - uVar4 & 0x3f) + 1);
  secp256k1_sha256_write(hash,(uchar *)&local_50,8);
  lVar3 = 0;
  do {
    uVar1 = hash->s[lVar3];
    *(uint *)((long)&local_48 + lVar3 * 4) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    hash->s[lVar3] = 0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  *(undefined8 *)(out32 + 0x10) = local_38;
  *(undefined8 *)(out32 + 0x18) = uStack_30;
  *(undefined8 *)out32 = local_48;
  *(undefined8 *)(out32 + 8) = uStack_40;
  return;
}

Assistant:

static void secp256k1_sha256_finalize(secp256k1_sha256 *hash, unsigned char *out32) {
    static const unsigned char pad[64] = {0x80, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0};
    uint32_t sizedesc[2];
    uint32_t out[8];
    int i = 0;
    sizedesc[0] = BE32(hash->bytes >> 29);
    sizedesc[1] = BE32(hash->bytes << 3);
    secp256k1_sha256_write(hash, pad, 1 + ((119 - (hash->bytes % 64)) % 64));
    secp256k1_sha256_write(hash, (const unsigned char*)sizedesc, 8);
    for (i = 0; i < 8; i++) {
        out[i] = BE32(hash->s[i]);
        hash->s[i] = 0;
    }
    memcpy(out32, (const unsigned char*)out, 32);
}